

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLargeDataWindowOffsets.cpp
# Opt level: O0

void anon_unknown.dwarf_212e3b::readfile(FrameBuffer *buf,char **channels,PixelType *pt)

{
  InputFile *this;
  Header *pHVar1;
  Box2i *this_00;
  InputFile infile;
  PixelType *in_stack_000000a8;
  char **in_stack_000000b0;
  Header *in_stack_000000b8;
  int in_stack_000001a4;
  char *in_stack_000001a8;
  InputFile *in_stack_000001b0;
  FrameBuffer *in_stack_00000218;
  InputFile *in_stack_00000220;
  InputFile local_28 [2];
  
  this = (InputFile *)std::__cxx11::string::c_str();
  Imf_2_5::globalThreadCount();
  Imf_2_5::InputFile::InputFile(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4);
  Imf_2_5::InputFile::header(local_28);
  setupBuffer(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,buf,channels._7_1_);
  Imf_2_5::ChannelList::~ChannelList((ChannelList *)0x221ee5);
  Imf_2_5::InputFile::setFrameBuffer(in_stack_00000220,in_stack_00000218);
  pHVar1 = Imf_2_5::InputFile::header(local_28);
  this_00 = Imf_2_5::Header::dataWindow((Header *)0x221f1a);
  Imf_2_5::InputFile::header(local_28);
  Imf_2_5::Header::dataWindow((Header *)0x221f4b);
  Imf_2_5::InputFile::readPixels(this,(int)((ulong)pHVar1 >> 0x20),(int)pHVar1);
  Imf_2_5::InputFile::~InputFile((InputFile *)this_00);
  return;
}

Assistant:

void
readfile (FrameBuffer & buf,      ///< list of channels to read: index to readingBuffer,
          const char * const *channels, // NULL terminated list of channels to write
             const PixelType *pt
        )
{
    InputFile infile (filename.c_str());
    setupBuffer(infile.header(),
                channels,pt,
                buf,
                false);
    infile.setFrameBuffer(buf);
    
    infile.readPixels (infile.header().dataWindow().min.y,
                       infile.header().dataWindow().max.y);

   
}